

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

void __thiscall
Catch::Generators::
SingleValueGenerator<unary_op_tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_trng::optimized_impl::uint128>_>
::~SingleValueGenerator
          (SingleValueGenerator<unary_op_tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_trng::optimized_impl::uint128>_>
           *this)

{
  pointer pcVar1;
  
  pcVar1 = (this->m_value).a._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->m_value).a.field_2) {
    operator_delete(pcVar1);
  }
  GeneratorUntypedBase::~GeneratorUntypedBase((GeneratorUntypedBase *)this);
  operator_delete(this);
  return;
}

Assistant:

SingleValueGenerator(T&& value) : m_value(std::move(value)) {}